

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::UnaryBinsSelectExprSyntax::setChild
          (UnaryBinsSelectExprSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  BinsSelectConditionExprSyntax *pBVar2;
  Token TVar3;
  
  if (index == 0) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->op).kind = TVar3.kind;
    (this->op).field_0x2 = TVar3._2_1_;
    (this->op).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->op).rawLen = TVar3.rawLen;
    (this->op).info = TVar3.info;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pBVar2 = (BinsSelectConditionExprSyntax *)0x0;
    }
    else {
      pBVar2 = (BinsSelectConditionExprSyntax *)TokenOrSyntax::node(&child);
    }
    (this->expr).ptr = pBVar2;
  }
  return;
}

Assistant:

void UnaryBinsSelectExprSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: op = child.token(); return;
        case 1: expr = child.node() ? &child.node()->as<BinsSelectConditionExprSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}